

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_drds_describe_drds_instances.cc
# Opt level: O2

int __thiscall
aliyun::Drds::DescribeDrdsInstances
          (Drds *this,DrdsDescribeDrdsInstancesRequestType *req,
          DrdsDescribeDrdsInstancesResponseType *response,DrdsErrorInfo *error_info)

{
  bool bVar1;
  int iVar2;
  ArrayIndex AVar3;
  Int IVar4;
  AliRpcRequest *this_00;
  Value *pVVar5;
  Value *pVVar6;
  Value *pVVar7;
  Value *pVVar8;
  uint index;
  char *pcVar9;
  uint index_00;
  allocator<char> local_49c;
  allocator<char> local_49b;
  allocator<char> local_49a;
  allocator<char> local_499;
  Value val;
  undefined1 local_468 [24];
  string local_450 [8];
  size_type local_448;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_440;
  _Alloc_hider local_430;
  size_type local_428;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_420;
  _Alloc_hider local_410;
  size_type local_408;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_400;
  _Alloc_hider local_3f0;
  size_type local_3e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e0;
  _Alloc_hider local_3d0;
  size_type local_3c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c0;
  _Alloc_hider local_3b0;
  size_type local_3a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a0;
  _Alloc_hider local_390;
  size_type local_388;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_380;
  long local_370;
  long local_368;
  string local_360;
  undefined1 local_340 [32];
  _Alloc_hider local_320;
  size_type local_318;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_310;
  _Alloc_hider local_300;
  size_type local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f0;
  string str_response;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string secheme;
  Reader reader;
  
  str_response._M_dataplus._M_p = (pointer)&str_response.field_2;
  str_response._M_string_length = 0;
  str_response.field_2._M_local_buf[0] = '\0';
  pcVar9 = "http";
  if (this->use_tls_ != false) {
    pcVar9 = "https";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&secheme,pcVar9,(allocator<char> *)&reader);
  this_00 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,this->version_,(allocator<char> *)local_468);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,this->appid_,(allocator<char> *)local_340);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,this->secret_,(allocator<char> *)&local_360);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 &secheme,"://");
  std::operator+(&local_1e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 this->host_);
  AliRpcRequest::AliRpcRequest(this_00,&local_180,&local_1a0,&local_1c0,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&reader);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_180);
  if (((this->use_tls_ == false) && (pcVar9 = this->proxy_host_, pcVar9 != (char *)0x0)) &&
     (*pcVar9 != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,pcVar9,(allocator<char> *)&reader);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_200);
    std::__cxx11::string::~string((string *)&local_200);
  }
  Json::Value::Value(&val,nullValue);
  Json::Reader::Reader(&reader);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"Action",(allocator<char> *)local_468);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240,"DescribeDrdsInstances",(allocator<char> *)local_340);
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_220,&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_220);
  if ((req->type)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_260,"Type",(allocator<char> *)local_468);
    std::__cxx11::string::string((string *)&local_280,(string *)req);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_260,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_260);
  }
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a0,"RegionId",(allocator<char> *)local_468);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2c0,this->region_id_,(allocator<char> *)local_340);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2a0,&local_2c0);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)&local_2a0);
  }
  iVar2 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar2 == 0) {
    iVar2 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&str_response);
    if (((0 < iVar2) && (str_response._M_string_length != 0)) &&
       (bVar1 = Json::Reader::parse(&reader,&str_response,&val,true), bVar1)) {
      if (error_info != (DrdsErrorInfo *)0x0 && iVar2 != 200) {
        bVar1 = Json::Value::isMember(&val,"RequestId");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"RequestId");
          Json::Value::asString_abi_cxx11_((string *)local_468,pVVar5);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_468,anon_var_dwarf_fb9f7 + 9,&local_499);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)local_468);
        std::__cxx11::string::~string((string *)local_468);
        bVar1 = Json::Value::isMember(&val,"Code");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"Code");
          Json::Value::asString_abi_cxx11_((string *)local_468,pVVar5);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_468,anon_var_dwarf_fb9f7 + 9,&local_49a);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)local_468);
        std::__cxx11::string::~string((string *)local_468);
        bVar1 = Json::Value::isMember(&val,"HostId");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"HostId");
          Json::Value::asString_abi_cxx11_((string *)local_468,pVVar5);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_468,anon_var_dwarf_fb9f7 + 9,&local_49b);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)local_468);
        std::__cxx11::string::~string((string *)local_468);
        bVar1 = Json::Value::isMember(&val,"Message");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"Message");
          Json::Value::asString_abi_cxx11_((string *)local_468,pVVar5);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_468,anon_var_dwarf_fb9f7 + 9,&local_49c);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)local_468);
        std::__cxx11::string::~string((string *)local_468);
      }
      if (response != (DrdsDescribeDrdsInstancesResponseType *)0x0 && iVar2 == 200) {
        bVar1 = Json::Value::isMember(&val,"Success");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"Success");
          bVar1 = Json::Value::asBool(pVVar5);
          response->success = bVar1;
        }
        bVar1 = Json::Value::isMember(&val,"Data");
        iVar2 = 200;
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"Data");
          bVar1 = Json::Value::isMember(pVVar5,"Instance");
          if (bVar1) {
            pVVar5 = Json::Value::operator[](&val,"Data");
            pVVar5 = Json::Value::operator[](pVVar5,"Instance");
            bVar1 = Json::Value::isArray(pVVar5);
            if (bVar1) {
              for (index = 0; AVar3 = Json::Value::size(pVVar5), index < AVar3; index = index + 1) {
                local_468._0_8_ = (pointer)0x0;
                local_468._8_8_ = (pointer)0x0;
                local_468._16_8_ = 0;
                local_450 = (string  [8])&local_440;
                local_448 = 0;
                local_440._M_local_buf[0] = '\0';
                local_430._M_p = (pointer)&local_420;
                local_428 = 0;
                local_420._M_local_buf[0] = '\0';
                local_410._M_p = (pointer)&local_400;
                local_408 = 0;
                local_400._M_local_buf[0] = '\0';
                local_3f0._M_p = (pointer)&local_3e0;
                local_3e8 = 0;
                local_3e0._M_local_buf[0] = '\0';
                local_3d0._M_p = (pointer)&local_3c0;
                local_3c8 = 0;
                local_3c0._M_local_buf[0] = '\0';
                local_3b0._M_p = (pointer)&local_3a0;
                local_3a8 = 0;
                local_3a0._M_local_buf[0] = '\0';
                local_390._M_p = (pointer)&local_380;
                local_388 = 0;
                local_380._M_local_buf[0] = '\0';
                pVVar6 = Json::Value::operator[](pVVar5,index);
                bVar1 = Json::Value::isMember(pVVar6,"DrdsInstanceId");
                if (bVar1) {
                  pVVar7 = Json::Value::operator[](pVVar6,"DrdsInstanceId");
                  Json::Value::asString_abi_cxx11_((string *)local_340,pVVar7);
                  std::__cxx11::string::operator=(local_450,(string *)local_340);
                  std::__cxx11::string::~string((string *)local_340);
                }
                bVar1 = Json::Value::isMember(pVVar6,"Type");
                if (bVar1) {
                  pVVar7 = Json::Value::operator[](pVVar6,"Type");
                  Json::Value::asString_abi_cxx11_((string *)local_340,pVVar7);
                  std::__cxx11::string::operator=((string *)&local_430,(string *)local_340);
                  std::__cxx11::string::~string((string *)local_340);
                }
                bVar1 = Json::Value::isMember(pVVar6,"RegionId");
                if (bVar1) {
                  pVVar7 = Json::Value::operator[](pVVar6,"RegionId");
                  Json::Value::asString_abi_cxx11_((string *)local_340,pVVar7);
                  std::__cxx11::string::operator=((string *)&local_410,(string *)local_340);
                  std::__cxx11::string::~string((string *)local_340);
                }
                bVar1 = Json::Value::isMember(pVVar6,"ZoneId");
                if (bVar1) {
                  pVVar7 = Json::Value::operator[](pVVar6,"ZoneId");
                  Json::Value::asString_abi_cxx11_((string *)local_340,pVVar7);
                  std::__cxx11::string::operator=((string *)&local_3f0,(string *)local_340);
                  std::__cxx11::string::~string((string *)local_340);
                }
                bVar1 = Json::Value::isMember(pVVar6,"Description");
                if (bVar1) {
                  pVVar7 = Json::Value::operator[](pVVar6,"Description");
                  Json::Value::asString_abi_cxx11_((string *)local_340,pVVar7);
                  std::__cxx11::string::operator=((string *)&local_3d0,(string *)local_340);
                  std::__cxx11::string::~string((string *)local_340);
                }
                bVar1 = Json::Value::isMember(pVVar6,"NetworkType");
                if (bVar1) {
                  pVVar7 = Json::Value::operator[](pVVar6,"NetworkType");
                  Json::Value::asString_abi_cxx11_((string *)local_340,pVVar7);
                  std::__cxx11::string::operator=((string *)&local_3b0,(string *)local_340);
                  std::__cxx11::string::~string((string *)local_340);
                }
                bVar1 = Json::Value::isMember(pVVar6,"Status");
                if (bVar1) {
                  pVVar7 = Json::Value::operator[](pVVar6,"Status");
                  Json::Value::asString_abi_cxx11_((string *)local_340,pVVar7);
                  std::__cxx11::string::operator=((string *)&local_390,(string *)local_340);
                  std::__cxx11::string::~string((string *)local_340);
                }
                bVar1 = Json::Value::isMember(pVVar6,"CreateTime");
                if (bVar1) {
                  pVVar7 = Json::Value::operator[](pVVar6,"CreateTime");
                  IVar4 = Json::Value::asInt(pVVar7);
                  local_370 = (long)IVar4;
                }
                bVar1 = Json::Value::isMember(pVVar6,"Version");
                if (bVar1) {
                  pVVar7 = Json::Value::operator[](pVVar6,"Version");
                  IVar4 = Json::Value::asInt(pVVar7);
                  local_368 = (long)IVar4;
                }
                bVar1 = Json::Value::isMember(pVVar6,"Vips");
                if (bVar1) {
                  pVVar7 = Json::Value::operator[](pVVar6,"Vips");
                  bVar1 = Json::Value::isMember(pVVar7,"Vip");
                  if (bVar1) {
                    pVVar6 = Json::Value::operator[](pVVar6,"Vips");
                    pVVar6 = Json::Value::operator[](pVVar6,"Vip");
                    bVar1 = Json::Value::isArray(pVVar6);
                    if (bVar1) {
                      for (index_00 = 0; AVar3 = Json::Value::size(pVVar6), index_00 < AVar3;
                          index_00 = index_00 + 1) {
                        local_340._0_8_ = local_340 + 0x10;
                        local_340._8_8_ = 0;
                        local_340[0x10] = '\0';
                        local_320._M_p = (pointer)&local_310;
                        local_318 = 0;
                        local_310._M_local_buf[0] = '\0';
                        local_300._M_p = (pointer)&local_2f0;
                        local_2f8 = 0;
                        local_2f0._M_local_buf[0] = '\0';
                        pVVar7 = Json::Value::operator[](pVVar6,index_00);
                        bVar1 = Json::Value::isMember(pVVar7,"IP");
                        if (bVar1) {
                          pVVar8 = Json::Value::operator[](pVVar7,"IP");
                          Json::Value::asString_abi_cxx11_(&local_360,pVVar8);
                          std::__cxx11::string::operator=((string *)local_340,(string *)&local_360);
                          std::__cxx11::string::~string((string *)&local_360);
                        }
                        bVar1 = Json::Value::isMember(pVVar7,"Port");
                        if (bVar1) {
                          pVVar8 = Json::Value::operator[](pVVar7,"Port");
                          Json::Value::asString_abi_cxx11_(&local_360,pVVar8);
                          std::__cxx11::string::operator=((string *)&local_320,(string *)&local_360)
                          ;
                          std::__cxx11::string::~string((string *)&local_360);
                        }
                        bVar1 = Json::Value::isMember(pVVar7,"Type");
                        if (bVar1) {
                          pVVar7 = Json::Value::operator[](pVVar7,"Type");
                          Json::Value::asString_abi_cxx11_(&local_360,pVVar7);
                          std::__cxx11::string::operator=((string *)&local_300,(string *)&local_360)
                          ;
                          std::__cxx11::string::~string((string *)&local_360);
                        }
                        std::
                        vector<aliyun::DrdsDescribeDrdsInstancesVipType,_std::allocator<aliyun::DrdsDescribeDrdsInstancesVipType>_>
                        ::push_back((vector<aliyun::DrdsDescribeDrdsInstancesVipType,_std::allocator<aliyun::DrdsDescribeDrdsInstancesVipType>_>
                                     *)local_468,(DrdsDescribeDrdsInstancesVipType *)local_340);
                        DrdsDescribeDrdsInstancesVipType::~DrdsDescribeDrdsInstancesVipType
                                  ((DrdsDescribeDrdsInstancesVipType *)local_340);
                      }
                    }
                  }
                }
                std::
                vector<aliyun::DrdsDescribeDrdsInstancesInstanceType,_std::allocator<aliyun::DrdsDescribeDrdsInstancesInstanceType>_>
                ::push_back(&response->data,(value_type *)local_468);
                DrdsDescribeDrdsInstancesInstanceType::~DrdsDescribeDrdsInstancesInstanceType
                          ((DrdsDescribeDrdsInstancesInstanceType *)local_468);
              }
              iVar2 = 200;
            }
          }
        }
      }
      goto LAB_00133ac8;
    }
  }
  iVar2 = -1;
  if (error_info != (DrdsErrorInfo *)0x0) {
    std::__cxx11::string::assign((char *)&error_info->code);
  }
LAB_00133ac8:
  AliRpcRequest::~AliRpcRequest(this_00);
  operator_delete(this_00,0x2c8);
  Json::Reader::~Reader(&reader);
  Json::Value::~Value(&val);
  std::__cxx11::string::~string((string *)&secheme);
  std::__cxx11::string::~string((string *)&str_response);
  return iVar2;
}

Assistant:

int Drds::DescribeDrdsInstances(const DrdsDescribeDrdsInstancesRequestType& req,
                      DrdsDescribeDrdsInstancesResponseType* response,
                       DrdsErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","DescribeDrdsInstances");
  if(!req.type.empty()) {
    req_rpc->AddRequestQuery("Type", req.type);
  }
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}